

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O0

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  ulong __n;
  reference pvVar2;
  reference this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDI;
  pointer *this_01;
  double dVar3;
  double pos_1;
  double pos;
  size_t n;
  size_t first_complement;
  double h;
  size_t row;
  scoped_lock guard;
  memory_order __b_1;
  memory_order __b;
  lightweight_mutex *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  double *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  double local_98;
  double local_88;
  double *local_60;
  
  boost::detail::lightweight_mutex::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if ((pointer)(ulong)*(uint *)&in_RDI[3].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage <
      in_RDI[3].
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_01 = &in_RDI[3].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__atomic_base<unsigned_int>::operator++((__atomic_base<unsigned_int> *)this_01);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    uVar1 = *(uint *)this_01;
    __n = (ulong)uVar1;
    dVar3 = ldexp(1.0,-uVar1);
    local_60 = (double *)0x0;
    ceil(((double)in_RDI[5].
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - dVar3) / (dVar3 + dVar3));
    itrunc<double>((double *)in_stack_fffffffffffffef0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](in_RDI,__n);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](in_RDI + 1,__n);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    for (local_88 = dVar3;
        local_88 <
        (double)in_RDI[5].
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88 = dVar3 + dVar3 + local_88) {
      if (local_88 <
          (double)in_RDI[6].
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
        local_60 = (double *)((long)local_60 + 1);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](in_RDI,__n);
      if ((double)in_RDI[6].
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start <= local_88) {
        abscissa_complement_at_t(in_stack_ffffffffffffff00);
      }
      else {
        abscissa_at_t((double *)in_stack_fffffffffffffef0);
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffef0,(value_type_conflict *)in_stack_fffffffffffffee8);
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),__n);
    *pvVar2 = (value_type)local_60;
    for (local_98 = dVar3;
        local_98 <
        (double)in_RDI[5].
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98 = dVar3 + dVar3 + local_98) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](in_RDI + 1,__n);
      weight_at_t(local_60);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_00,(value_type_conflict *)in_stack_fffffffffffffee8);
    }
  }
  boost::detail::lightweight_mutex::scoped_lock::~scoped_lock((scoped_lock *)0x121241);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }